

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZLinearAnalysis.cpp
# Opt level: O0

TPZMatrixSolver<double> * __thiscall
TPZLinearAnalysis::MatrixSolver<double>(TPZLinearAnalysis *this)

{
  long in_RDI;
  TPZMatrixSolver<double> *tmp;
  size_t in_stack_000003f8;
  char *in_stack_00000400;
  TPZMatrixSolver<double> *local_28;
  
  if (*(long *)(in_RDI + 0x170) == 0) {
    local_28 = (TPZMatrixSolver<double> *)0x0;
  }
  else {
    local_28 = (TPZMatrixSolver<double> *)
               __dynamic_cast(*(long *)(in_RDI + 0x170),&TPZSolver::typeinfo,
                              &TPZMatrixSolver<double>::typeinfo,0);
  }
  if ((*(long *)(in_RDI + 0x170) != 0) && (local_28 == (TPZMatrixSolver<double> *)0x0)) {
    std::operator<<((ostream *)&std::cerr,
                    "TPZMatrixSolver<TVar> &TPZLinearAnalysis::MatrixSolver() [TVar = double]");
    std::operator<<((ostream *)&std::cerr," incompatible Solver type! Aborting\n");
    pzinternal::DebugStopImpl(in_stack_00000400,in_stack_000003f8);
  }
  return local_28;
}

Assistant:

TPZMatrixSolver<TVar> &TPZLinearAnalysis::MatrixSolver(){
    const auto tmp = dynamic_cast<TPZMatrixSolver<TVar>*>(fSolver);
    if(fSolver && !tmp){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<" incompatible Solver type! Aborting\n";
        DebugStop();
    }
    return *tmp;
}